

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ConditionalDirectiveExpressionSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((((kind == BinaryConditionalDirectiveExpression) ||
       (kind == NamedConditionalDirectiveExpression)) ||
      (kind == ParenthesizedConditionalDirectiveExpression)) ||
     (kind == UnaryConditionalDirectiveExpression)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ConditionalDirectiveExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BinaryConditionalDirectiveExpression:
        case SyntaxKind::NamedConditionalDirectiveExpression:
        case SyntaxKind::ParenthesizedConditionalDirectiveExpression:
        case SyntaxKind::UnaryConditionalDirectiveExpression:
            return true;
        default:
            return false;
    }
}